

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O0

void __thiscall amrex::MLNodeLaplacian::checkPoint(MLNodeLaplacian *this,string *file_name)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  _Ios_Openmode __a;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  BoxArray *this_00;
  ostream *poVar7;
  const_reference pvVar8;
  ostream *poVar9;
  MLLinOp *in_RDI;
  int ilev_1;
  ofstream HeaderFile_1;
  string HeaderFileName_1;
  int ilev;
  ofstream HeaderFile;
  string HeaderFileName;
  undefined1 in_stack_000007e3;
  How in_stack_000007e4;
  string *in_stack_000007e8;
  FabArray<amrex::FArrayBox> *in_stack_000007f0;
  size_type in_stack_fffffffffffff878;
  MLLinOp *in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff888;
  undefined4 in_stack_fffffffffffff88c;
  char *in_stack_fffffffffffff8a0;
  _Ios_Openmode in_stack_fffffffffffff8a8;
  int in_stack_fffffffffffff8ac;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
  *in_stack_fffffffffffff8b0;
  Geometry *in_stack_fffffffffffff8b8;
  ostream *in_stack_fffffffffffff8c8;
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [23];
  undefined1 in_stack_fffffffffffffacf;
  string *in_stack_fffffffffffffad0;
  int local_524;
  long local_520 [64];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  int local_240;
  long local_230 [64];
  string local_30 [48];
  
  bVar1 = ParallelContext::IOProcessorSub();
  if (bVar1) {
    UtilCreateCleanDirectory(in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                   in_stack_fffffffffffff8a0);
    std::ofstream::ofstream(local_230);
    _Var3 = std::__cxx11::string::c_str();
    __a = std::operator|(_S_out,_S_trunc);
    std::operator|(__a,_S_bin);
    std::ofstream::open((char *)local_230,_Var3);
    bVar2 = std::ios::good();
    if ((bVar2 & 1) == 0) {
      FileOpenFailed((string *)in_stack_fffffffffffff8b8);
    }
    std::ios_base::precision((ios_base *)((long)local_230 + *(long *)(local_230[0] + -0x18)),0x11);
    poVar6 = std::operator<<((ostream *)local_230,"verbose = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,in_RDI->verbose);
    poVar6 = std::operator<<(poVar6,"\n");
    this_00 = (BoxArray *)std::operator<<(poVar6,"nlevs = ");
    iVar4 = MLLinOp::NAMRLevels(in_RDI);
    poVar6 = (ostream *)std::ostream::operator<<(this_00,iVar4);
    poVar7 = std::operator<<(poVar6,"\n");
    poVar7 = std::operator<<(poVar7,"do_agglomeration = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(bool)((in_RDI->info).do_agglomeration & 1))
    ;
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"do_consolidation = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(bool)((in_RDI->info).do_consolidation & 1))
    ;
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"agg_grid_size = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(in_RDI->info).agg_grid_size);
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"con_grid_size = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(in_RDI->info).con_grid_size);
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"has_metric_term = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(bool)((in_RDI->info).has_metric_term & 1));
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"max_coarsening_level = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(in_RDI->info).max_coarsening_level);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<((ostream *)local_230,"lobc = ");
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    pvVar8 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                       ((array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffff880,
                        in_stack_fffffffffffff878);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pvVar8);
    poVar7 = std::operator<<(poVar7," ");
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    pvVar8 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                       ((array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffff880,
                        in_stack_fffffffffffff878);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pvVar8);
    poVar7 = std::operator<<(poVar7," ");
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    pvVar8 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                       ((array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffff880,
                        in_stack_fffffffffffff878);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pvVar8);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<((ostream *)local_230,"hibc = ");
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    pvVar8 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                       ((array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffff880,
                        in_stack_fffffffffffff878);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pvVar8);
    poVar7 = std::operator<<(poVar7," ");
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    pvVar8 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                       ((array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffff880,
                        in_stack_fffffffffffff878);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pvVar8);
    poVar7 = std::operator<<(poVar7," ");
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    pvVar8 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                       ((array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffff880,
                        in_stack_fffffffffffff878);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pvVar8);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<((ostream *)local_230,"maxorder = ");
    iVar4 = MLLinOp::getMaxOrder(in_RDI);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<((ostream *)local_230,"is_rz = ");
    poVar7 = (ostream *)
             std::ostream::operator<<(poVar7,*(int *)(in_RDI[2].m_coarse_bc_loc.vect + 1));
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<((ostream *)local_230,"m_const_sigma = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_RDI[2].m_coarse_bc_loc.vect[2]);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<((ostream *)local_230,"use_gauss_seidel = ");
    poVar7 = (ostream *)
             std::ostream::operator<<
                       (poVar7,(bool)(*(byte *)&in_RDI[3].m_grids.
                                                super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                                .
                                                super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish & 1));
    std::operator<<(poVar7,"\n");
    in_stack_fffffffffffff8c8 = std::operator<<((ostream *)local_230,"use_harmonic_average = ");
    poVar7 = (ostream *)
             std::ostream::operator<<
                       (in_stack_fffffffffffff8c8,
                        (bool)(*(byte *)((long)&in_RDI[3].m_grids.
                                                super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                                .
                                                super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish + 1) & 1)
                       );
    std::operator<<(poVar7,"\n");
    in_stack_fffffffffffff8b8 =
         (Geometry *)std::operator<<((ostream *)local_230,"coarsen_strategy = ");
    in_stack_fffffffffffff8b0 =
         (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
          *)std::ostream::operator<<
                      (in_stack_fffffffffffff8b8,*(int *)&in_RDI[2].m_needs_coarse_data_for_bc);
    std::operator<<((ostream *)in_stack_fffffffffffff8b0,"\n");
    std::ofstream::~ofstream(local_230);
    std::__cxx11::string::~string(local_30);
    local_240 = 0;
    while (in_stack_fffffffffffff8ac = local_240, iVar4 = MLLinOp::NAMRLevels(in_RDI),
          in_stack_fffffffffffff8ac < iVar4) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                     in_stack_fffffffffffff8a0);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
      std::operator+((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
                      *)in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
      UtilCreateCleanDirectory(in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_280);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                     in_stack_fffffffffffff8a0);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
      std::operator+((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
                      *)in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                     (char *)in_stack_fffffffffffff880);
      std::__cxx11::string::~string(local_2e0);
      std::__cxx11::string::~string(local_320);
      std::__cxx11::string::~string(local_300);
      std::ofstream::ofstream(local_520);
      in_stack_fffffffffffff8a0 = (char *)std::__cxx11::string::c_str();
      in_stack_fffffffffffff8a8 = std::operator|(_S_out,_S_trunc);
      std::operator|(in_stack_fffffffffffff8a8,_S_bin);
      std::ofstream::open((char *)local_520,(_Ios_Openmode)in_stack_fffffffffffff8a0);
      bVar2 = std::ios::good();
      if ((bVar2 & 1) == 0) {
        FileOpenFailed((string *)in_stack_fffffffffffff8b8);
      }
      std::ios_base::precision((ios_base *)((long)local_520 + *(long *)(local_520[0] + -0x18)),0x11)
      ;
      MLLinOp::Geom(in_stack_fffffffffffff880,(int)(in_stack_fffffffffffff878 >> 0x20),
                    (int)in_stack_fffffffffffff878);
      poVar9 = amrex::operator<<(poVar7,in_stack_fffffffffffff8b8);
      std::operator<<(poVar9,"\n");
      Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffff880,in_stack_fffffffffffff878);
      BoxArray::writeOn(this_00,poVar6);
      std::operator<<((ostream *)local_520,"\n");
      std::ofstream::~ofstream(local_520);
      std::__cxx11::string::~string(local_2c0);
      local_240 = local_240 + 1;
    }
  }
  ParallelContext::BarrierSub();
  local_524 = 0;
  while (iVar4 = local_524, iVar5 = MLLinOp::NAMRLevels(in_RDI), iVar4 < iVar5) {
    Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                  *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
    ::operator[]((Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                  *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
    operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                       0x12f5b2c);
    if (bVar1) {
      Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                    *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
      in_stack_fffffffffffff878 = 0;
      Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
      ::operator[]((Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                    *)in_stack_fffffffffffff880,0);
      std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
      operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                  *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
      in_stack_fffffffffffff880 =
           (MLLinOp *)
           std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                     ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                      in_stack_fffffffffffff880);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                     in_stack_fffffffffffff8a0);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
      std::operator+((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
                      *)in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar4,in_stack_fffffffffffff888),(char *)in_stack_fffffffffffff880);
      VisMF::Write(in_stack_000007f0,in_stack_000007e8,in_stack_000007e4,(bool)in_stack_000007e3);
      std::__cxx11::string::~string(local_548);
      std::__cxx11::string::~string(local_568);
      std::__cxx11::string::~string(local_5a8);
      std::__cxx11::string::~string(local_588);
    }
    local_524 = local_524 + 1;
  }
  return;
}

Assistant:

void
MLNodeLaplacian::checkPoint (std::string const& file_name) const
{
    if (ParallelContext::IOProcessorSub())
    {
        UtilCreateCleanDirectory(file_name, false);
        {
            std::string HeaderFileName(file_name+"/Header");
            std::ofstream HeaderFile;
            HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                                                    std::ofstream::trunc |
                                                    std::ofstream::binary);
            if( ! HeaderFile.good()) {
                FileOpenFailed(HeaderFileName);
            }

            HeaderFile.precision(17);

            // MLLinop stuff
            HeaderFile << "verbose = " << verbose << "\n"
                       << "nlevs = " << NAMRLevels() << "\n"
                       << "do_agglomeration = " << info.do_agglomeration << "\n"
                       << "do_consolidation = " << info.do_consolidation << "\n"
                       << "agg_grid_size = " << info.agg_grid_size << "\n"
                       << "con_grid_size = " << info.con_grid_size << "\n"
                       << "has_metric_term = " << info.has_metric_term << "\n"
                       << "max_coarsening_level = " << info.max_coarsening_level << "\n";
#if (AMREX_SPACEDIM == 1)
            HeaderFile << "lobc = " << static_cast<int>(m_lobc[0][0]) << "\n";
#elif (AMREX_SPACEDIM == 2)
            HeaderFile << "lobc = " << static_cast<int>(m_lobc[0][0])
                       << " "       << static_cast<int>(m_lobc[0][1]) << "\n";
#else
            HeaderFile << "lobc = " << static_cast<int>(m_lobc[0][0])
                       << " "       << static_cast<int>(m_lobc[0][1])
                       << " "       << static_cast<int>(m_lobc[0][2]) << "\n";
#endif
#if (AMREX_SPACEDIM == 1)
            HeaderFile << "hibc = " << static_cast<int>(m_hibc[0][0]) << "\n";
#elif (AMREX_SPACEDIM == 2)
            HeaderFile << "hibc = " << static_cast<int>(m_hibc[0][0])
                       << " "       << static_cast<int>(m_hibc[0][1]) << "\n";
#else
            HeaderFile << "hibc = " << static_cast<int>(m_hibc[0][0])
                       << " "       << static_cast<int>(m_hibc[0][1])
                       << " "       << static_cast<int>(m_hibc[0][2]) << "\n";
#endif
            // m_coarse_data_for_bc: not used
            HeaderFile << "maxorder = " << getMaxOrder() << "\n";

            // MLNodeLaplacian stuff
            HeaderFile << "is_rz = " << m_is_rz << "\n";
            HeaderFile << "m_const_sigma = " << m_const_sigma << "\n";
            HeaderFile << "use_gauss_seidel = " << m_use_gauss_seidel << "\n";
            HeaderFile << "use_harmonic_average = " << m_use_harmonic_average << "\n";
            HeaderFile << "coarsen_strategy = " << static_cast<int>(m_coarsening_strategy) << "\n";
            // No level bc multifab
        }

        for (int ilev = 0; ilev < NAMRLevels(); ++ilev)
        {
            UtilCreateCleanDirectory(file_name+"/Level_"+std::to_string(ilev), false);
            std::string HeaderFileName(file_name+"/Level_"+std::to_string(ilev)+"/Header");
            std::ofstream HeaderFile;
            HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                                                    std::ofstream::trunc |
                                                    std::ofstream::binary);
            if( ! HeaderFile.good()) {
                FileOpenFailed(HeaderFileName);
            }

            HeaderFile.precision(17);

            HeaderFile << Geom(ilev) << "\n";
            m_grids[ilev][0].writeOn(HeaderFile);  HeaderFile << "\n";
        }
    }

    ParallelContext::BarrierSub();

    for (int ilev = 0; ilev < NAMRLevels(); ++ilev)
    {
        if (m_sigma[ilev][0][0]) {
            VisMF::Write(*m_sigma[ilev][0][0], file_name+"/Level_"+std::to_string(ilev)+"/sigma");
        }
    }
}